

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O1

void __thiscall
testing::internal::StreamingListener::AbstractSocketWriter::SendLn
          (AbstractSocketWriter *this,string *message)

{
  pointer pcVar1;
  long in_FS_OFFSET;
  size_type *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  __str.field_2._8_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pcVar1 = (message->_M_dataplus)._M_p;
  local_48 = &__str._M_string_length;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + message->_M_string_length);
  std::__cxx11::string::append((char *)&local_48);
  (*this->_vptr_AbstractSocketWriter[2])(this,&local_48);
  if (local_48 != &__str._M_string_length) {
    operator_delete(local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == __str.field_2._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendLn(const string& message) {
					Send(message + "\n");
				}